

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SimpleSequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleSequenceExprSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::SequenceRepetitionSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,SequenceRepetitionSyntax **args_1)

{
  SequenceRepetitionSyntax *pSVar1;
  SimpleSequenceExprSyntax *pSVar2;
  
  pSVar2 = (SimpleSequenceExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleSequenceExprSyntax *)this->endPtr < pSVar2 + 1) {
    pSVar2 = (SimpleSequenceExprSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pSVar2 + 1);
  }
  pSVar1 = *args_1;
  (pSVar2->super_SequenceExprSyntax).super_SyntaxNode.kind = SimpleSequenceExpr;
  (pSVar2->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar2->super_SequenceExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar2->expr).ptr = args;
  pSVar2->repetition = pSVar1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pSVar2;
  if (pSVar1 != (SequenceRepetitionSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = (SyntaxNode *)pSVar2;
  }
  return pSVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }